

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeM6.cpp
# Opt level: O0

metric6_def_t * ComputeM6::GetTable(char *m6_prefix)

{
  int iVar1;
  ulong local_28;
  size_t i;
  metric6_def_t *ret;
  size_t m6_size;
  char *m6_prefix_local;
  
  i = 0;
  for (local_28 = 0; local_28 < 0x12; local_28 = local_28 + 1) {
    iVar1 = strcmp(m6_prefix,m6_metrics_list[local_28].m6_prefix);
    if (iVar1 == 0) {
      i = (size_t)(m6_metrics_list + local_28);
    }
  }
  return (metric6_def_t *)i;
}

Assistant:

metric6_def_t const * ComputeM6::GetTable(char const * m6_prefix)
{
    size_t m6_size = sizeof(m6_metrics_list) / sizeof(metric6_def_t);
    metric6_def_t const * ret = NULL;

    for (size_t i = 0; i < m6_size; i++) {
        if (strcmp(m6_prefix, m6_metrics_list[i].m6_prefix) == 0) {
            ret = &m6_metrics_list[i];
        }
    }

    return ret;
}